

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

char * escape_string_internal(char *s,int single_quote)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  ushort **ppuVar4;
  byte bVar5;
  byte *pbVar6;
  
  sVar2 = strlen(s);
  pbVar3 = (byte *)malloc(sVar2 * 4 + 4);
  pbVar6 = pbVar3;
  do {
    bVar5 = *s;
    switch((ulong)bVar5) {
    case 0:
      *pbVar6 = 0;
      return (char *)pbVar3;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
switchD_00147f91_caseD_1:
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (ulong)bVar5 * 2 + 1) & 0x40) == 0) {
        bVar1 = bVar5 >> 4 | 0x30;
        if (0x9f < bVar5) {
          bVar1 = (bVar5 >> 4) + 0x37;
        }
        pbVar6[0] = 0x5c;
        pbVar6[1] = 0x78;
        pbVar6[2] = bVar1;
        bVar5 = bVar5 & 0xf;
        bVar1 = bVar5 + 0x30;
        if (9 < bVar5) {
          bVar1 = bVar5 + 0x37;
        }
        pbVar6[3] = bVar1;
        pbVar6 = pbVar6 + 4;
      }
      else {
        *pbVar6 = bVar5;
LAB_00148073:
        pbVar6 = pbVar6 + 1;
      }
      goto LAB_00148083;
    case 7:
      pbVar6[0] = 0x5c;
      pbVar6[1] = 0x61;
      break;
    case 8:
      pbVar6[0] = 0x5c;
      pbVar6[1] = 0x62;
      break;
    case 9:
      pbVar6[0] = 0x5c;
      pbVar6[1] = 0x74;
      break;
    case 10:
      pbVar6[0] = 0x5c;
      pbVar6[1] = 0x6e;
      break;
    case 0xb:
      pbVar6[0] = 0x5c;
      pbVar6[1] = 0x76;
      break;
    case 0xc:
      pbVar6[0] = 0x5c;
      pbVar6[1] = 0x66;
      break;
    case 0xd:
      pbVar6[0] = 0x5c;
      pbVar6[1] = 0x72;
      break;
    default:
      if (bVar5 == 0x22) {
        if (single_quote != 0) {
          *pbVar6 = 0x22;
          goto LAB_00148073;
        }
        pbVar6[0] = 0x5c;
        pbVar6[1] = 0x22;
      }
      else if (bVar5 == 0x27) {
        if (single_quote == 0) {
          *pbVar6 = 0x27;
          goto LAB_00148073;
        }
        pbVar6[0] = 0x5c;
        pbVar6[1] = 0x27;
      }
      else {
        if (bVar5 != 0x5c) goto switchD_00147f91_caseD_1;
        pbVar6[0] = 0x5c;
        pbVar6[1] = 0x5c;
      }
    }
    pbVar6 = pbVar6 + 2;
LAB_00148083:
    s = (char *)((byte *)s + 1);
  } while( true );
}

Assistant:

static char *escape_string_internal(char *s, int single_quote) {
  char *ss = (char *)MALLOC((strlen(s) + 1) * 4), *sss = ss;
  for (; *s; s++) {
    switch (*s) {
      case '\b':
        ESC('b');
      case '\f':
        ESC('f');
      case '\n':
        ESC('n');
      case '\r':
        ESC('r');
      case '\t':
        ESC('t');
      case '\v':
        ESC('v');
      case '\a':
        ESC('a');
      case '\\':
        ESC('\\');
      case '\"':
        if (!single_quote) {
          ESC(*s);
        }
        *ss++ = *s;
        break;
      case '\'':
        if (single_quote) {
          ESC(*s);
        }
        *ss++ = *s;
        break;
      default:
        if (isprint_(*s))
          *ss++ = *s;
        else {
          *ss++ = '\\';
          *ss++ = 'x';
          *ss++ = tohex2((unsigned char)*s);
          *ss++ = tohex1((unsigned char)*s);
        }
        break;
    }
  }
  *ss = 0;
  return sss;
}